

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRender.cpp
# Opt level: O1

void __thiscall
vkt::sr::ShaderRenderCaseInstance::uploadSparseImage
          (ShaderRenderCaseInstance *this,TextureFormat *texFormat,TextureData *textureData,
          Sampler *refSampler,deUint32 mipLevels,deUint32 arrayLayers,VkImage sparseImage,
          VkImageCreateInfo *imageCreateInfo,UVec3 texSize)

{
  DeviceInterface *pDVar1;
  int *piVar2;
  int iVar3;
  VkImageLayout VVar4;
  VkImageLayout VVar5;
  uint uVar6;
  void *pvVar7;
  Allocator *pAVar8;
  VkBuffer buffer_00;
  VkBuffer obj;
  undefined8 uVar9;
  bool bVar10;
  VkStructureType VVar11;
  deUint32 dVar12;
  int iVar13;
  uint uVar14;
  VkResult VVar15;
  deUint32 dVar16;
  VkDevice_s *device;
  DeviceDriver *vk;
  VkPhysicalDevice physicalDevice;
  VkQueue pVVar17;
  InstanceInterface *vk_00;
  NotSupportedError *pNVar18;
  long lVar19;
  pointer pvVar20;
  byte bVar21;
  int iVar22;
  VkImageLayout VVar23;
  VkImageLayout VVar24;
  uint uVar25;
  uint uVar26;
  byte *pbVar27;
  TextureFormat *format;
  ulong uVar28;
  ulong uVar29;
  uint uVar30;
  uint uVar31;
  VkImageLayout VVar32;
  VkImageLayout VVar33;
  ConstPixelBufferAccess *access;
  pointer pCVar34;
  uint uVar35;
  uint uVar36;
  int iVar37;
  ulong uVar38;
  Move<vk::VkCommandBuffer_s_*> cmdBuffer;
  uint local_8bc;
  uint local_8b8;
  VkImageMemoryBarrier preImageBarrier;
  vector<unsigned_int,_std::allocator<unsigned_int>_> offsetMultiples;
  ulong local_800;
  Move<vk::Handle<(vk::HandleType)24>_> cmdPool;
  Move<vk::Handle<(vk::HandleType)6>_> fence;
  VkImageMemoryBarrier postImageBarrier;
  vector<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_> copyRegions;
  ulong local_730;
  VkSubmitInfo submitInfo;
  MovePtr<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_> bufferAlloc;
  Move<vk::Handle<(vk::HandleType)8>_> buffer;
  VkBufferMemoryBarrier preBufferBarrier;
  VkSemaphore local_618;
  Deleter<vk::Handle<(vk::HandleType)4>_> DStack_610;
  long local_5f0;
  long local_5e8;
  ulong local_5e0;
  VkPipelineStageFlags pipelineStageFlags;
  VkBufferCreateInfo bufferParams;
  VkCommandBufferBeginInfo cmdBufferBeginInfo;
  VkPhysicalDeviceMemoryProperties deviceMemoryProperties;
  VkPhysicalDeviceProperties deviceProperties;
  
  if (this->m_imageBackingMode == IMAGE_BACKING_MODE_SPARSE) {
    device = (((this->m_sparseContext).
               super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
               .m_data.ptr)->m_device).super_RefBase<vk::VkDevice_s_*>.m_data.object;
  }
  else {
    device = Context::getDevice((this->super_TestInstance).m_context);
  }
  if (this->m_imageBackingMode == IMAGE_BACKING_MODE_SPARSE) {
    vk = &((this->m_sparseContext).
           super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
           .m_data.ptr)->m_deviceInterface;
  }
  else {
    vk = (DeviceDriver *)Context::getDeviceInterface((this->super_TestInstance).m_context);
  }
  physicalDevice = Context::getPhysicalDevice((this->super_TestInstance).m_context);
  if (this->m_imageBackingMode == IMAGE_BACKING_MODE_SPARSE) {
    pVVar17 = ((this->m_sparseContext).
               super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
               .m_data.ptr)->m_queue;
  }
  else {
    pVVar17 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  }
  if (this->m_imageBackingMode == IMAGE_BACKING_MODE_SPARSE) {
    dVar16 = ((this->m_sparseContext).
              super_UniqueBase<vkt::sr::ShaderRenderCaseInstance::SparseContext,_de::DefaultDeleter<vkt::sr::ShaderRenderCaseInstance::SparseContext>_>
              .m_data.ptr)->m_queueFamilyIndex;
  }
  else {
    dVar16 = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  }
  vk_00 = Context::getInstanceInterface((this->super_TestInstance).m_context);
  ::vk::getPhysicalDeviceProperties(&deviceProperties,vk_00,physicalDevice);
  ::vk::getPhysicalDeviceMemoryProperties(&deviceMemoryProperties,vk_00,physicalDevice);
  VVar11 = VK_STRUCTURE_TYPE_DEVICE_QUEUE_CREATE_INFO - (refSampler->compare == COMPAREMODE_NONE);
  ::vk::createSemaphore
            ((Move<vk::Handle<(vk::HandleType)4>_> *)&preImageBarrier,&vk->super_DeviceInterface,
             device,0,(VkAllocationCallbacks *)0x0);
  DStack_610.m_device = (VkDevice)preImageBarrier._16_8_;
  DStack_610.m_allocator = (VkAllocationCallbacks *)preImageBarrier._24_8_;
  local_618.m_internal = preImageBarrier._0_8_;
  DStack_610.m_deviceIface = (DeviceInterface *)preImageBarrier.pNext;
  offsetMultiples.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  offsetMultiples.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  offsetMultiples.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  preImageBarrier.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
            (&offsetMultiples,(iterator)0x0,&preImageBarrier.sType);
  preImageBarrier.sType = tcu::TextureFormat::getPixelSize(texFormat);
  if (offsetMultiples.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      offsetMultiples.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&offsetMultiples,
               (iterator)
               offsetMultiples.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish,&preImageBarrier.sType);
  }
  else {
    *offsetMultiples.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = preImageBarrier.sType;
    offsetMultiples.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         offsetMultiples.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  bVar10 = isImageSizeSupported
                     (imageCreateInfo->imageType,(UVec3 *)texSize.m_data._0_8_,
                      &deviceProperties.limits);
  if (!bVar10) {
    pNVar18 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar18,"Image size not supported for device.",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
               ,0x59b);
    __cxa_throw(pNVar18,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  pvVar20 = (textureData->
            super__Vector_base<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_730 = 0;
  if (pvVar20 !=
      (textureData->
      super__Vector_base<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    uVar36 = 0;
    do {
      for (pCVar34 = (pvVar20->
                     super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                     )._M_impl.super__Vector_impl_data._M_start;
          pCVar34 !=
          (pvVar20->
          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
          )._M_impl.super__Vector_impl_data._M_finish; pCVar34 = pCVar34 + 1) {
        dVar12 = sr::anon_unknown_0::getNextMultiple(&offsetMultiples,uVar36);
        iVar3 = (pCVar34->m_size).m_data[0];
        iVar22 = (pCVar34->m_size).m_data[1];
        iVar37 = (pCVar34->m_size).m_data[2];
        iVar13 = tcu::TextureFormat::getPixelSize(&pCVar34->m_format);
        uVar36 = iVar37 * iVar13 * iVar22 * iVar3 + dVar12;
      }
      pvVar20 = pvVar20 + 1;
    } while (pvVar20 !=
             (textureData->
             super__Vector_base<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish);
    local_730 = (ulong)uVar36;
  }
  buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal._0_4_ = 0;
  (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0x10])
            (vk,device,sparseImage.m_internal,&buffer,0);
  postImageBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  postImageBarrier._4_4_ = 0;
  postImageBarrier.pNext = (void *)0x0;
  postImageBarrier.srcAccessMask = 0;
  postImageBarrier.dstAccessMask = 0;
  std::
  vector<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
  ::resize((vector<vk::VkSparseImageMemoryRequirements,_std::allocator<vk::VkSparseImageMemoryRequirements>_>
            *)&postImageBarrier,
           (ulong)(uint)buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                        m_internal);
  (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0x10])
            (vk,device,sparseImage.m_internal,&buffer,postImageBarrier._0_8_);
  uVar28 = 0xffffffff;
  if ((uint)buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal != 0) {
    uVar36 = 0;
    pbVar27 = (byte *)postImageBarrier._0_8_;
    do {
      if ((*pbVar27 & 1) != 0) {
        uVar28 = (ulong)uVar36;
        break;
      }
      uVar36 = uVar36 + 1;
      pbVar27 = pbVar27 + 0x30;
    } while ((uint)buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal !=
             uVar36);
  }
  if ((int)uVar28 == -1) {
    pNVar18 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (pNVar18,
               "Not supported image aspect - the test supports currently only VK_IMAGE_ASPECT_COLOR_BIT."
               ,(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
               ,0x5c2);
    __cxa_throw(pNVar18,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  ::vk::getImageMemoryRequirements
            ((VkMemoryRequirements *)&submitInfo,&vk->super_DeviceInterface,device,sparseImage);
  if (deviceMemoryProperties.memoryTypeCount != 0) {
    uVar38 = 0;
    do {
      if (((submitInfo.waitSemaphoreCount >> ((uint)uVar38 & 0x1f) & 1) != 0) &&
         (bVar10 = ::vk::MemoryRequirement::matchesHeap
                             ((MemoryRequirement *)&::vk::MemoryRequirement::Any,
                              deviceMemoryProperties.memoryTypes[uVar38].propertyFlags), bVar10)) {
        if (uVar38 != 0xffffffff) {
          if ((ulong)submitInfo._0_8_ <= deviceProperties.limits.sparseAddressSpaceSize) {
            ::vk::getPhysicalDeviceSparseImageFormatProperties
                      ((vector<vk::VkSparseImageFormatProperties,_std::allocator<vk::VkSparseImageFormatProperties>_>
                        *)&bufferParams,vk_00,physicalDevice,imageCreateInfo->format,
                       imageCreateInfo->imageType,imageCreateInfo->samples,imageCreateInfo->usage,
                       imageCreateInfo->tiling);
            if (bufferParams.pNext != (void *)CONCAT44(bufferParams._4_4_,bufferParams.sType)) {
              lVar19 = uVar28 * 0x30;
              VVar4 = *(VkImageLayout *)(postImageBarrier._0_8_ + 4 + lVar19);
              VVar5 = *(VkImageLayout *)(postImageBarrier._0_8_ + 8 + lVar19);
              uVar36 = *(uint *)(postImageBarrier._0_8_ + 0xc + lVar19);
              uVar6 = *(uint *)(postImageBarrier._0_8_ + 0x10 + lVar19);
              iVar3 = *(int *)(postImageBarrier._0_8_ + 0x14 + lVar19);
              pvVar7 = *(void **)(postImageBarrier._0_8_ + 0x18 + lVar19);
              local_5e8 = *(long *)(postImageBarrier._0_8_ + 0x20 + lVar19);
              local_5f0 = *(long *)(postImageBarrier._0_8_ + 0x28 + lVar19);
              preBufferBarrier.srcAccessMask = 0;
              preBufferBarrier.dstAccessMask = 0;
              preBufferBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
              preBufferBarrier._4_4_ = 0;
              preBufferBarrier.pNext = (void *)0x0;
              fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_device =
                   (VkDevice)0x0;
              fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal = 0;
              fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_deviceIface =
                   (DeviceInterface *)0x0;
              if (arrayLayers != 0) {
                local_5e0 = (ulong)arrayLayers;
                local_800 = 0;
                do {
                  if (iVar3 != 0) {
                    iVar22 = 0;
                    do {
                      bVar21 = (byte)iVar22;
                      uVar14 = (imageCreateInfo->extent).width >> (bVar21 & 0x1f);
                      uVar14 = uVar14 + (uVar14 == 0);
                      uVar31 = (imageCreateInfo->extent).height >> (bVar21 & 0x1f);
                      uVar31 = uVar31 + (uVar31 == 0);
                      uVar30 = (imageCreateInfo->extent).depth >> (bVar21 & 0x1f);
                      uVar30 = uVar30 + (uVar30 == 0);
                      VVar32 = uVar14 % VVar4;
                      VVar23 = uVar31 % VVar5;
                      VVar24 = VVar23;
                      if (VVar23 == VK_IMAGE_LAYOUT_UNDEFINED) {
                        VVar24 = VVar5;
                      }
                      VVar33 = VVar32;
                      if (VVar32 == VK_IMAGE_LAYOUT_UNDEFINED) {
                        VVar33 = VVar4;
                      }
                      uVar25 = uVar30 % uVar36;
                      uVar26 = uVar25;
                      if (uVar25 == 0) {
                        uVar26 = uVar36;
                      }
                      uVar30 = (uint)(uVar25 != 0) + uVar30 / uVar36;
                      if (uVar30 != 0) {
                        uVar14 = uVar14 / VVar4 + (uint)(VVar32 != VK_IMAGE_LAYOUT_UNDEFINED);
                        uVar31 = uVar31 / VVar5 + (uint)(VVar23 != VK_IMAGE_LAYOUT_UNDEFINED);
                        local_8bc = 0;
                        do {
                          if (uVar31 != 0) {
                            uVar25 = uVar36;
                            if (local_8bc == uVar30 - 1) {
                              uVar25 = uVar26;
                            }
                            local_8b8 = 0;
                            do {
                              if (uVar14 != 0) {
                                VVar23 = VVar5;
                                if (local_8b8 == uVar31 - 1) {
                                  VVar23 = VVar24;
                                }
                                iVar37 = 0;
                                uVar35 = 0;
                                do {
                                  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.
                                  object.m_internal = (deUint64)submitInfo.pNext;
                                  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.
                                  deleter.m_deviceIface = (DeviceInterface *)submitInfo.pNext;
                                  cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.
                                  deleter.m_device =
                                       (VkDevice)
                                       CONCAT44(cmdPool.
                                                super_RefBase<vk::Handle<(vk::HandleType)24>_>.
                                                m_data.deleter.m_device._4_4_,
                                                submitInfo.waitSemaphoreCount);
                                  (*this->m_memAlloc->_vptr_Allocator[3])
                                            (&preImageBarrier,this->m_memAlloc,&cmdPool);
                                  uVar9 = preImageBarrier._0_8_;
                                  preImageBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
                                  preImageBarrier._4_4_ = 0;
                                  cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.
                                  m_deviceIface = (DeviceInterface *)0x0;
                                  cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object =
                                       (VkCommandBuffer_s *)uVar9;
                                  cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.
                                  m_deviceIface = (DeviceInterface *)operator_new(0x20);
                                  *(undefined4 *)
                                   &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.
                                    m_deviceIface[1]._vptr_DeviceInterface = 0;
                                  *(undefined4 *)
                                   ((long)&cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.
                                           deleter.m_deviceIface[1]._vptr_DeviceInterface + 4) = 0;
                                  (cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.
                                  m_deviceIface)->_vptr_DeviceInterface =
                                       (_func_int **)&PTR__SharedPtrState_00d1fc38;
                                  cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.
                                  m_deviceIface[2]._vptr_DeviceInterface = (_func_int **)uVar9;
                                  *(undefined4 *)
                                   &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.
                                    m_deviceIface[1]._vptr_DeviceInterface = 1;
                                  *(undefined4 *)
                                   ((long)&cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.
                                           deleter.m_deviceIface[1]._vptr_DeviceInterface + 4) = 1;
                                  std::
                                  vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
                                  ::push_back(&this->m_allocations,(value_type *)&cmdBuffer);
                                  preImageBarrier.oldLayout = VVar4;
                                  if (uVar14 - 1 == uVar35) {
                                    preImageBarrier.oldLayout = VVar33;
                                  }
                                  preImageBarrier._4_4_ = iVar22;
                                  preImageBarrier.sType = VVar11;
                                  preImageBarrier.pNext = (void *)CONCAT44(iVar37,(int)local_800);
                                  preImageBarrier.dstAccessMask = local_8bc * uVar36;
                                  preImageBarrier.srcAccessMask = local_8b8 * VVar5;
                                  preImageBarrier.newLayout = VVar23;
                                  preImageBarrier.srcQueueFamilyIndex = uVar25;
                                  preImageBarrier.image.m_internal =
                                       *(deUint64 *)
                                        (cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.
                                         object + 8);
                                  preImageBarrier.subresourceRange._0_8_ =
                                       *(undefined8 *)
                                        (cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.
                                         object + 0x10);
                                  preImageBarrier.subresourceRange._8_8_ =
                                       preImageBarrier.subresourceRange._8_8_ & 0xffffffff00000000;
                                  if (preBufferBarrier.pNext == (void *)preBufferBarrier._16_8_) {
                                    std::
                                    vector<vk::VkSparseImageMemoryBind,std::allocator<vk::VkSparseImageMemoryBind>>
                                    ::_M_realloc_insert<vk::VkSparseImageMemoryBind_const&>
                                              ((vector<vk::VkSparseImageMemoryBind,std::allocator<vk::VkSparseImageMemoryBind>>
                                                *)&preBufferBarrier,(iterator)preBufferBarrier.pNext
                                               ,(VkSparseImageMemoryBind *)&preImageBarrier);
                                  }
                                  else {
                                    *(undefined8 *)((long)preBufferBarrier.pNext + 0x30) =
                                         preImageBarrier.subresourceRange._0_8_;
                                    *(undefined8 *)((long)preBufferBarrier.pNext + 0x38) =
                                         preImageBarrier.subresourceRange._8_8_;
                                    *(undefined8 *)((long)preBufferBarrier.pNext + 0x20) =
                                         preImageBarrier._32_8_;
                                    *(deUint64 *)((long)preBufferBarrier.pNext + 0x28) =
                                         preImageBarrier.image.m_internal;
                                    *(undefined8 *)((long)preBufferBarrier.pNext + 0x10) =
                                         preImageBarrier._16_8_;
                                    *(undefined8 *)((long)preBufferBarrier.pNext + 0x18) =
                                         preImageBarrier._24_8_;
                                    *(VkStructureType *)preBufferBarrier.pNext = VVar11;
                                    *(int *)((long)preBufferBarrier.pNext + 4) = iVar22;
                                    *(int *)((long)preBufferBarrier.pNext + 8) = (int)local_800;
                                    *(int *)((long)preBufferBarrier.pNext + 0xc) = iVar37;
                                    preBufferBarrier.pNext =
                                         (void *)((long)preBufferBarrier.pNext + 0x40);
                                  }
                                  if (cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.
                                      deleter.m_deviceIface != (DeviceInterface *)0x0) {
                                    LOCK();
                                    pDVar1 = cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data
                                             .deleter.m_deviceIface + 1;
                                    *(int *)&pDVar1->_vptr_DeviceInterface =
                                         *(int *)&pDVar1->_vptr_DeviceInterface + -1;
                                    UNLOCK();
                                    if (*(int *)&pDVar1->_vptr_DeviceInterface == 0) {
                                      cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object
                                           = (VkCommandBuffer_s *)0x0;
                                      (*(cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.
                                         deleter.m_deviceIface)->_vptr_DeviceInterface[2])();
                                    }
                                    LOCK();
                                    piVar2 = (int *)((long)&cmdBuffer.
                                                            super_RefBase<vk::VkCommandBuffer_s_*>.
                                                            m_data.deleter.m_deviceIface[1].
                                                            _vptr_DeviceInterface + 4);
                                    *piVar2 = *piVar2 + -1;
                                    UNLOCK();
                                    if (*piVar2 == 0) {
                                      if (cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.
                                          deleter.m_deviceIface != (DeviceInterface *)0x0) {
                                        (*(cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.
                                           deleter.m_deviceIface)->_vptr_DeviceInterface[1])();
                                      }
                                      cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.
                                      deleter.m_deviceIface = (DeviceInterface *)0x0;
                                    }
                                  }
                                  uVar35 = uVar35 + 1;
                                  iVar37 = iVar37 + VVar4;
                                } while (uVar35 < uVar14);
                              }
                              local_8b8 = local_8b8 + 1;
                            } while (local_8b8 < uVar31);
                          }
                          local_8bc = local_8bc + 1;
                        } while (local_8bc < uVar30);
                      }
                      iVar22 = iVar22 + 1;
                    } while (iVar22 != iVar3);
                  }
                  if ((fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.
                       m_deviceIface ==
                       (DeviceInterface *)
                       fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal)
                     || ((uVar6 & 1) == 0)) {
                    cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                    m_deviceIface = (DeviceInterface *)submitInfo.pNext;
                    cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
                         (VkDevice)
                         CONCAT44(cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.
                                  deleter.m_device._4_4_,submitInfo.waitSemaphoreCount);
                    cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal
                         = (deUint64)pvVar7;
                    (*this->m_memAlloc->_vptr_Allocator[3])
                              (&preImageBarrier,this->m_memAlloc,&cmdPool,0);
                    uVar9 = preImageBarrier._0_8_;
                    preImageBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
                    preImageBarrier._4_4_ = 0;
                    cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface =
                         (DeviceInterface *)0x0;
                    cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object =
                         (VkCommandBuffer_s *)uVar9;
                    cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface =
                         (DeviceInterface *)operator_new(0x20);
                    *(undefined4 *)
                     &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface
                      [1]._vptr_DeviceInterface = 0;
                    *(undefined4 *)
                     ((long)&cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.
                             m_deviceIface[1]._vptr_DeviceInterface + 4) = 0;
                    (cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface)
                    ->_vptr_DeviceInterface = (_func_int **)&PTR__SharedPtrState_00d1fc38;
                    cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface[2]
                    ._vptr_DeviceInterface = (_func_int **)uVar9;
                    *(undefined4 *)
                     &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface
                      [1]._vptr_DeviceInterface = 1;
                    *(undefined4 *)
                     ((long)&cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.
                             m_deviceIface[1]._vptr_DeviceInterface + 4) = 1;
                    preImageBarrier._0_8_ = local_5f0 * local_800 + local_5e8;
                    preImageBarrier._16_8_ =
                         *(undefined8 *)
                          (cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object + 8);
                    preImageBarrier._24_8_ =
                         *(undefined8 *)
                          (cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object + 0x10);
                    preImageBarrier._32_8_ = preImageBarrier._32_8_ & 0xffffffff00000000;
                    preImageBarrier.pNext = pvVar7;
                    std::
                    vector<de::SharedPtr<vk::Allocation>,_std::allocator<de::SharedPtr<vk::Allocation>_>_>
                    ::push_back(&this->m_allocations,(value_type *)&cmdBuffer);
                    if ((VkDevice)
                        fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.
                        m_deviceIface ==
                        fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_device)
                    {
                      std::vector<vk::VkSparseMemoryBind,std::allocator<vk::VkSparseMemoryBind>>::
                      _M_realloc_insert<vk::VkSparseMemoryBind_const&>
                                ((vector<vk::VkSparseMemoryBind,std::allocator<vk::VkSparseMemoryBind>>
                                  *)&fence,
                                 (iterator)
                                 fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.
                                 m_deviceIface,(VkSparseMemoryBind *)&preImageBarrier);
                    }
                    else {
                      fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.
                      m_deviceIface[4]._vptr_DeviceInterface = (_func_int **)preImageBarrier._32_8_;
                      fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.
                      m_deviceIface[2]._vptr_DeviceInterface = (_func_int **)preImageBarrier._16_8_;
                      fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.
                      m_deviceIface[3]._vptr_DeviceInterface = (_func_int **)preImageBarrier._24_8_;
                      *(VkStructureType *)
                       &(fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.
                        m_deviceIface)->_vptr_DeviceInterface = preImageBarrier.sType;
                      *(undefined4 *)
                       ((long)&(fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.
                               m_deviceIface)->_vptr_DeviceInterface + 4) = preImageBarrier._4_4_;
                      *(undefined4 *)
                       &fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.
                        m_deviceIface[1]._vptr_DeviceInterface = preImageBarrier.pNext._0_4_;
                      *(undefined4 *)
                       ((long)&fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.
                               m_deviceIface[1]._vptr_DeviceInterface + 4) =
                           preImageBarrier.pNext._4_4_;
                      fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.
                      m_deviceIface =
                           fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.
                           m_deviceIface + 5;
                    }
                    if (cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.
                        m_deviceIface != (DeviceInterface *)0x0) {
                      LOCK();
                      pDVar1 = cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.
                               m_deviceIface + 1;
                      *(int *)&pDVar1->_vptr_DeviceInterface =
                           *(int *)&pDVar1->_vptr_DeviceInterface + -1;
                      UNLOCK();
                      if (*(int *)&pDVar1->_vptr_DeviceInterface == 0) {
                        cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object =
                             (VkCommandBuffer_s *)0x0;
                        (*(cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.
                          m_deviceIface)->_vptr_DeviceInterface[2])();
                      }
                      LOCK();
                      piVar2 = (int *)((long)&cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.
                                              m_data.deleter.m_deviceIface[1]._vptr_DeviceInterface
                                      + 4);
                      *piVar2 = *piVar2 + -1;
                      UNLOCK();
                      if (*piVar2 == 0) {
                        if (cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.
                            m_deviceIface != (DeviceInterface *)0x0) {
                          (*(cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.
                            m_deviceIface)->_vptr_DeviceInterface[1])();
                        }
                        cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.
                        m_deviceIface = (DeviceInterface *)0x0;
                      }
                    }
                  }
                  local_800 = local_800 + 1;
                } while (local_800 != local_5e0);
              }
              preImageBarrier.pNext = (void *)0x0;
              preImageBarrier.subresourceRange.levelCount = 0;
              preImageBarrier.subresourceRange.baseArrayLayer = 0;
              preImageBarrier.srcQueueFamilyIndex = 0;
              preImageBarrier.dstQueueFamilyIndex = 0;
              preImageBarrier.image.m_internal = 0;
              preImageBarrier.srcAccessMask = 0;
              preImageBarrier.dstAccessMask = 0;
              preImageBarrier.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
              preImageBarrier.newLayout = VK_IMAGE_LAYOUT_UNDEFINED;
              preImageBarrier.sType = VK_STRUCTURE_TYPE_BIND_SPARSE_INFO;
              preImageBarrier._4_4_ = 0;
              uVar28 = (long)preBufferBarrier.pNext - preBufferBarrier._0_8_;
              if (uVar28 != 0) {
                cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal =
                     sparseImage.m_internal;
                cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface
                     = (DeviceInterface *)
                       CONCAT44(cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.
                                deleter.m_deviceIface._4_4_,(int)(uVar28 >> 6));
                cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
                     (VkDevice)preBufferBarrier._0_8_;
              }
              preImageBarrier._65_7_ = 0;
              preImageBarrier.subresourceRange.layerCount._0_1_ = uVar28 != 0;
              uVar28 = (long)fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.
                             m_deviceIface -
                       fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal;
              if (uVar28 != 0) {
                cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object =
                     (VkCommandBuffer_s *)sparseImage.m_internal;
                cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface =
                     (DeviceInterface *)
                     CONCAT44(cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.
                              m_deviceIface._4_4_,(int)(uVar28 >> 3) * -0x33333333);
                cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device =
                     (VkDevice)
                     fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal;
                preImageBarrier.subresourceRange._8_8_ = &cmdBuffer;
              }
              preImageBarrier.subresourceRange._1_7_ = 0;
              preImageBarrier.subresourceRange.aspectMask._0_1_ = uVar28 != 0;
              VVar15 = (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0x11])
                                 (vk,pVVar17,1,&preImageBarrier,0);
              ::vk::checkResult(VVar15,"vk.queueBindSparse(queue, 1u, &bindSparseInfo, DE_NULL)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                                ,0x661);
              if (fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal != 0)
              {
                operator_delete((void *)fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.
                                        object.m_internal,
                                (long)fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.
                                      deleter.m_device -
                                fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.
                                m_internal);
              }
              if (preBufferBarrier._0_8_ != 0) {
                operator_delete((void *)preBufferBarrier._0_8_,
                                preBufferBarrier._16_8_ - preBufferBarrier._0_8_);
              }
              pvVar7 = (void *)CONCAT44(bufferParams._4_4_,bufferParams.sType);
              if (pvVar7 != (void *)0x0) {
                operator_delete(pvVar7,CONCAT44(bufferParams._20_4_,bufferParams.flags) -
                                       (long)pvVar7);
              }
              if (postImageBarrier._0_8_ != 0) {
                operator_delete((void *)postImageBarrier._0_8_,
                                postImageBarrier._16_8_ - postImageBarrier._0_8_);
              }
              cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
                   (VkDevice)0x0;
              cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
                   (VkAllocationCallbacks *)0x0;
              cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal = 0;
              cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
                   (DeviceInterface *)0x0;
              cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device =
                   (VkDevice)0x0;
              cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal = 0;
              cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object =
                   (VkCommandBuffer_s *)0x0;
              cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface =
                   (DeviceInterface *)0x0;
              ::vk::createCommandPool
                        ((Move<vk::Handle<(vk::HandleType)24>_> *)&postImageBarrier,
                         &vk->super_DeviceInterface,device,1,dVar16,(VkAllocationCallbacks *)0x0);
              preImageBarrier.srcAccessMask = postImageBarrier.srcAccessMask;
              preImageBarrier.dstAccessMask = postImageBarrier.dstAccessMask;
              preImageBarrier.oldLayout = postImageBarrier.oldLayout;
              preImageBarrier.newLayout = postImageBarrier.newLayout;
              preImageBarrier.sType = postImageBarrier.sType;
              preImageBarrier._4_4_ = postImageBarrier._4_4_;
              preImageBarrier.pNext = postImageBarrier.pNext;
              postImageBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
              postImageBarrier._4_4_ = 0;
              postImageBarrier.pNext = (void *)0x0;
              postImageBarrier.srcAccessMask = 0;
              postImageBarrier.dstAccessMask = 0;
              postImageBarrier.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
              postImageBarrier.newLayout = VK_IMAGE_LAYOUT_UNDEFINED;
              if (cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal !=
                  0) {
                ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
                          (&cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter,
                           (VkCommandPool)
                           cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
                           m_internal);
              }
              cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
                   (VkDevice)preImageBarrier._16_8_;
              cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
                   (VkAllocationCallbacks *)preImageBarrier._24_8_;
              cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal =
                   preImageBarrier._0_8_;
              cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
                   (DeviceInterface *)preImageBarrier.pNext;
              if (postImageBarrier._0_8_ != 0) {
                ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
                          ((Deleter<vk::Handle<(vk::HandleType)24>_> *)&postImageBarrier.pNext,
                           (VkCommandPool)postImageBarrier._0_8_);
              }
              ::vk::allocateCommandBuffer
                        ((Move<vk::VkCommandBuffer_s_*> *)&postImageBarrier,
                         &vk->super_DeviceInterface,device,
                         (VkCommandPool)
                         cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
                         m_internal,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
              preImageBarrier.srcAccessMask = postImageBarrier.srcAccessMask;
              preImageBarrier.dstAccessMask = postImageBarrier.dstAccessMask;
              preImageBarrier.oldLayout = postImageBarrier.oldLayout;
              preImageBarrier.newLayout = postImageBarrier.newLayout;
              preImageBarrier.sType = postImageBarrier.sType;
              preImageBarrier._4_4_ = postImageBarrier._4_4_;
              preImageBarrier.pNext = postImageBarrier.pNext;
              postImageBarrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
              postImageBarrier._4_4_ = 0;
              postImageBarrier.pNext = (void *)0x0;
              postImageBarrier.srcAccessMask = 0;
              postImageBarrier.dstAccessMask = 0;
              postImageBarrier.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
              postImageBarrier.newLayout = VK_IMAGE_LAYOUT_UNDEFINED;
              if (cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object !=
                  (VkCommandBuffer_s *)0x0) {
                submitInfo._0_8_ = cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
                (*(cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface)->
                  _vptr_DeviceInterface[0x48])
                          (cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.
                           m_deviceIface,
                           cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device,
                           cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.
                           m_internal,1);
              }
              cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device =
                   (VkDevice)CONCAT44(preImageBarrier.dstAccessMask,preImageBarrier.srcAccessMask);
              cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal.
              _4_4_ = preImageBarrier.newLayout;
              cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal.
              _0_4_ = preImageBarrier.oldLayout;
              cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object =
                   (VkCommandBuffer_s *)preImageBarrier._0_8_;
              cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface =
                   (DeviceInterface *)preImageBarrier.pNext;
              if (postImageBarrier._0_8_ != 0) {
                preImageBarrier.sType = postImageBarrier.sType;
                preImageBarrier._4_4_ = postImageBarrier._4_4_;
                (**(code **)(*postImageBarrier.pNext + 0x240))
                          (postImageBarrier.pNext,postImageBarrier._16_8_,postImageBarrier._24_8_,1)
                ;
              }
              bufferParams.sType = VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO;
              bufferParams.pNext = (void *)0x0;
              bufferParams.flags = 0;
              bufferParams.size = local_730;
              bufferParams.usage = 1;
              bufferParams.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
              bufferParams.queueFamilyIndexCount = 0;
              bufferParams.pQueueFamilyIndices = (deUint32 *)0x0;
              ::vk::createBuffer(&buffer,&vk->super_DeviceInterface,device,&bufferParams,
                                 (VkAllocationCallbacks *)0x0);
              pAVar8 = this->m_memAlloc;
              buffer_00.m_internal._4_4_ =
                   buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal.
                   _4_4_;
              buffer_00.m_internal._0_4_ =
                   (uint)buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                         m_internal;
              ::vk::getBufferMemoryRequirements
                        ((VkMemoryRequirements *)&preImageBarrier,&vk->super_DeviceInterface,device,
                         buffer_00);
              (*pAVar8->_vptr_Allocator[3])(&bufferAlloc,pAVar8,&preImageBarrier,1);
              VVar15 = (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0xc])
                                 (vk,device,
                                  CONCAT44(buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.
                                           m_data.object.m_internal._4_4_,
                                           (uint)buffer.
                                                 super_RefBase<vk::Handle<(vk::HandleType)8>_>.
                                                 m_data.object.m_internal),
                                  ((bufferAlloc.
                                    super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
                                    .m_data.ptr)->m_memory).m_internal,
                                  (bufferAlloc.
                                   super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
                                   .m_data.ptr)->m_offset);
              ::vk::checkResult(VVar15,
                                "vk.bindBufferMemory(vkDevice, *buffer, bufferAlloc->getMemory(), bufferAlloc->getOffset())"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                                ,0x67c);
              preBufferBarrier.sType = VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER;
              dVar16 = 0;
              preBufferBarrier.pNext = (void *)0x0;
              preBufferBarrier.srcAccessMask = 0x4000;
              preBufferBarrier.dstAccessMask = 0x800;
              preBufferBarrier.srcQueueFamilyIndex = 0xffffffff;
              preBufferBarrier.dstQueueFamilyIndex = 0xffffffff;
              preBufferBarrier.buffer.m_internal =
                   CONCAT44(buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                            m_internal._4_4_,
                            (uint)buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object
                                  .m_internal);
              preBufferBarrier.offset = 0;
              preBufferBarrier.size = local_730;
              preImageBarrier.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
              preImageBarrier.pNext = (void *)0x0;
              preImageBarrier.srcAccessMask = 0;
              preImageBarrier.dstAccessMask = 0x1000;
              preImageBarrier.oldLayout = VK_IMAGE_LAYOUT_UNDEFINED;
              preImageBarrier.newLayout = VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL;
              preImageBarrier.srcQueueFamilyIndex = 0xffffffff;
              preImageBarrier.dstQueueFamilyIndex = 0xffffffff;
              preImageBarrier.image = sparseImage;
              preImageBarrier.subresourceRange.baseMipLevel = 0;
              preImageBarrier.subresourceRange.aspectMask = VVar11;
              preImageBarrier.subresourceRange.baseArrayLayer = 0;
              preImageBarrier.subresourceRange.levelCount = mipLevels;
              preImageBarrier.subresourceRange.layerCount = arrayLayers;
              postImageBarrier.sType = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
              postImageBarrier.pNext = (void *)0x0;
              postImageBarrier.srcAccessMask = 0x1000;
              postImageBarrier.dstAccessMask = 0x20;
              postImageBarrier.oldLayout = VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL;
              postImageBarrier.newLayout = VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL;
              postImageBarrier.srcQueueFamilyIndex = 0xffffffff;
              postImageBarrier.dstQueueFamilyIndex = 0xffffffff;
              postImageBarrier.image = sparseImage;
              postImageBarrier.subresourceRange.baseMipLevel = 0;
              postImageBarrier.subresourceRange.baseArrayLayer = 0;
              cmdBufferBeginInfo.flags = 1;
              cmdBufferBeginInfo._20_4_ = 0;
              cmdBufferBeginInfo.pInheritanceInfo = (VkCommandBufferInheritanceInfo *)0x0;
              cmdBufferBeginInfo.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO;
              cmdBufferBeginInfo._4_4_ = 0;
              cmdBufferBeginInfo.pNext = (void *)0x0;
              copyRegions.
              super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              copyRegions.
              super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              copyRegions.
              super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              pvVar20 = (textureData->
                        super__Vector_base<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              postImageBarrier.subresourceRange.aspectMask = VVar11;
              postImageBarrier.subresourceRange.levelCount = mipLevels;
              postImageBarrier.subresourceRange.layerCount = arrayLayers;
              if ((textureData->
                  super__Vector_base<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish != pvVar20) {
                pvVar7 = (bufferAlloc.
                          super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                          m_data.ptr)->m_hostPtr;
                uVar28 = 0;
                do {
                  pCVar34 = pvVar20[uVar28].
                            super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  if (pvVar20[uVar28].
                      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                      ._M_impl.super__Vector_impl_data._M_finish != pCVar34) {
                    lVar19 = 8;
                    uVar38 = 0;
                    do {
                      dVar16 = sr::anon_unknown_0::getNextMultiple(&offsetMultiples,dVar16);
                      format = (TextureFormat *)((long)(pCVar34->m_size).m_data + lVar19 + -0x10);
                      uVar29 = (ulong)dVar16;
                      tcu::PixelBufferAccess::PixelBufferAccess
                                ((PixelBufferAccess *)&fence,format,
                                 (IVec3 *)((long)(pCVar34->m_size).m_data + lVar19 + -8),
                                 (void *)((long)pvVar7 + uVar29));
                      submitInfo.pNext =
                           (void *)CONCAT44(*(undefined4 *)
                                             ((long)(pCVar34->m_size).m_data + lVar19 + -4),
                                            *(undefined4 *)
                                             ((long)(pCVar34->m_size).m_data + lVar19 + -8));
                      submitInfo._20_4_ = SUB84(uVar28,0);
                      submitInfo.pWaitSemaphores._0_4_ = (undefined4)uVar38;
                      submitInfo.pWaitSemaphores._4_4_ = 1;
                      submitInfo.pWaitDstStageMask._0_4_ = 0;
                      submitInfo.pWaitDstStageMask._4_4_ = 0;
                      submitInfo.commandBufferCount = 0;
                      submitInfo._44_4_ = *(uint *)((long)(pCVar34->m_size).m_data + lVar19 + -8);
                      submitInfo.pCommandBuffers =
                           (VkCommandBuffer *)
                           CONCAT44(*(undefined4 *)((long)(pCVar34->m_size).m_data + lVar19),
                                    *(undefined4 *)((long)(pCVar34->m_size).m_data + lVar19 + -4));
                      submitInfo._0_8_ = uVar29;
                      submitInfo.waitSemaphoreCount = VVar11;
                      if (copyRegions.
                          super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                          ._M_impl.super__Vector_impl_data._M_finish ==
                          copyRegions.
                          super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                        std::vector<vk::VkBufferImageCopy,std::allocator<vk::VkBufferImageCopy>>::
                        _M_realloc_insert<vk::VkBufferImageCopy_const&>
                                  ((vector<vk::VkBufferImageCopy,std::allocator<vk::VkBufferImageCopy>>
                                    *)&copyRegions,
                                   (iterator)
                                   copyRegions.
                                   super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                                   ._M_impl.super__Vector_impl_data._M_finish,
                                   (VkBufferImageCopy *)&submitInfo);
                      }
                      else {
                        *(VkCommandBuffer **)
                         &((copyRegions.
                            super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                            ._M_impl.super__Vector_impl_data._M_finish)->imageExtent).height =
                             submitInfo.pCommandBuffers;
                        ((copyRegions.
                          super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                          ._M_impl.super__Vector_impl_data._M_finish)->imageOffset).x = 0;
                        ((copyRegions.
                          super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                          ._M_impl.super__Vector_impl_data._M_finish)->imageOffset).y = 0;
                        *(ulong *)&((copyRegions.
                                     super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                                     ._M_impl.super__Vector_impl_data._M_finish)->imageOffset).z =
                             (ulong)(uint)submitInfo._44_4_ << 0x20;
                        ((copyRegions.
                          super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                          ._M_impl.super__Vector_impl_data._M_finish)->imageSubresource).aspectMask
                             = VVar11;
                        ((copyRegions.
                          super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                          ._M_impl.super__Vector_impl_data._M_finish)->imageSubresource).mipLevel =
                             submitInfo._20_4_;
                        ((copyRegions.
                          super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                          ._M_impl.super__Vector_impl_data._M_finish)->imageSubresource).
                        baseArrayLayer = submitInfo.pWaitSemaphores._0_4_;
                        ((copyRegions.
                          super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                          ._M_impl.super__Vector_impl_data._M_finish)->imageSubresource).layerCount
                             = 1;
                        (copyRegions.
                         super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                         ._M_impl.super__Vector_impl_data._M_finish)->bufferOffset = uVar29;
                        *(void **)&(copyRegions.
                                    super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                                    ._M_impl.super__Vector_impl_data._M_finish)->bufferRowLength =
                             submitInfo.pNext;
                        copyRegions.
                        super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                        ._M_impl.super__Vector_impl_data._M_finish =
                             copyRegions.
                             super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                             ._M_impl.super__Vector_impl_data._M_finish + 1;
                      }
                      tcu::copy((EVP_PKEY_CTX *)&fence,(EVP_PKEY_CTX *)format);
                      iVar3 = *(int *)((long)(pCVar34->m_size).m_data + lVar19 + -8);
                      iVar22 = *(int *)((long)(pCVar34->m_size).m_data + lVar19 + -4);
                      iVar37 = *(int *)((long)(pCVar34->m_size).m_data + lVar19);
                      iVar13 = tcu::TextureFormat::getPixelSize(format);
                      dVar16 = iVar37 * iVar13 * iVar22 * iVar3 + dVar16;
                      uVar38 = uVar38 + 1;
                      pCVar34 = pvVar20[uVar28].
                                super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                ._M_impl.super__Vector_impl_data._M_start;
                      lVar19 = lVar19 + 0x28;
                    } while (uVar38 < (ulong)(((long)pvVar20[uVar28].
                                                                                                          
                                                  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                               (long)pCVar34 >> 3) * -0x3333333333333333));
                  }
                  uVar28 = uVar28 + 1;
                  pvVar20 = (textureData->
                            super__Vector_base<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start;
                } while (uVar28 < (ulong)(((long)(textureData->
                                                 super__Vector_base<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>,_std::allocator<std::vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_finish -
                                           (long)pvVar20 >> 3) * -0x5555555555555555));
              }
              VVar15 = (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0x49])
                                 (vk,cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
                                  &cmdBufferBeginInfo);
              ::vk::checkResult(VVar15,"vk.beginCommandBuffer(*cmdBuffer, &cmdBufferBeginInfo)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                                ,0x6e9);
              (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0x6d])
                        (vk,cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0x4000,
                         0x1000,0,0,0,1,&preBufferBarrier,1,&preImageBarrier);
              (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0x62])
                        (vk,cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
                         CONCAT44(buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object
                                  .m_internal._4_4_,
                                  (uint)buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
                                        object.m_internal),sparseImage.m_internal,7,
                         (ulong)(uint)((int)((ulong)((long)copyRegions.
                                                                                                                      
                                                  super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)copyRegions.
                                                                                                                
                                                  super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                                      -0x49249249),
                         copyRegions.
                         super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                         ._M_impl.super__Vector_impl_data._M_start);
              (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0x6d])
                        (vk,cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0x1000,1,
                         0,0,0,0,0,1,&postImageBarrier);
              VVar15 = (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0x4a])
                                 (vk,cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object)
              ;
              ::vk::checkResult(VVar15,"vk.endCommandBuffer(*cmdBuffer)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                                ,0x6ed);
              submitInfo.pWaitDstStageMask = &pipelineStageFlags;
              pipelineStageFlags = 0x8000;
              submitInfo.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
              submitInfo.pNext = (void *)0x0;
              submitInfo.waitSemaphoreCount = 1;
              submitInfo.pWaitSemaphores = &local_618;
              submitInfo.commandBufferCount = 1;
              submitInfo.signalSemaphoreCount = 0;
              submitInfo.pSignalSemaphores = (VkSemaphore *)0x0;
              submitInfo.pCommandBuffers = (VkCommandBuffer *)&cmdBuffer;
              ::vk::createFence(&fence,&vk->super_DeviceInterface,device,0,
                                (VkAllocationCallbacks *)0x0);
              VVar15 = (*(vk->super_DeviceInterface)._vptr_DeviceInterface[2])
                                 (vk,pVVar17,1,&submitInfo,
                                  fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.
                                  m_internal);
              ::vk::checkResult(VVar15,"vk.queueSubmit(queue, 1, &submitInfo, *fence)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                                ,0x702);
              VVar15 = (*(vk->super_DeviceInterface)._vptr_DeviceInterface[0x16])
                                 (vk,device,1,&fence,1,0xffffffffffffffff);
              ::vk::checkResult(VVar15,"vk.waitForFences(vkDevice, 1, &fence.get(), true, ~(0ull) )"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                                ,0x703);
              if (fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal != 0)
              {
                ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()
                          (&fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter,
                           (VkFence)fence.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.
                                    object.m_internal);
              }
              if (copyRegions.
                  super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(copyRegions.
                                super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                                ._M_impl.super__Vector_impl_data._M_start,
                                (long)copyRegions.
                                      super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)copyRegions.
                                      super__Vector_base<vk::VkBufferImageCopy,_std::allocator<vk::VkBufferImageCopy>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              if (bufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                  m_data.ptr != (Allocation *)0x0) {
                (*(bufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>
                   .m_data.ptr)->_vptr_Allocation[1])();
                bufferAlloc.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                m_data.ptr = (Allocation *)0x0;
              }
              obj.m_internal._4_4_ =
                   buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal.
                   _4_4_;
              obj.m_internal._0_4_ =
                   (uint)buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
                         m_internal;
              if (obj.m_internal != 0) {
                ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)8>_>::operator()
                          (&buffer.super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter,obj)
                ;
              }
              if (cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object !=
                  (VkCommandBuffer_s *)0x0) {
                preImageBarrier._0_8_ =
                     cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object;
                (*(cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface)->
                  _vptr_DeviceInterface[0x48])
                          (cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.
                           m_deviceIface,
                           cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device,
                           cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.
                           m_internal,1);
              }
              if (cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal !=
                  0) {
                ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()
                          (&cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter,
                           (VkCommandPool)
                           cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
                           m_internal);
              }
              if (offsetMultiples.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(offsetMultiples.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)offsetMultiples.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)offsetMultiples.
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              if (local_618.m_internal != 0) {
                ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)4>_>::operator()
                          (&DStack_610,local_618);
              }
              return;
            }
            pNVar18 = (NotSupportedError *)__cxa_allocate_exception(0x38);
            tcu::NotSupportedError::NotSupportedError
                      (pNVar18,"The image format does not support sparse operations.",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                       ,0x5dc);
            __cxa_throw(pNVar18,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
          }
          pNVar18 = (NotSupportedError *)__cxa_allocate_exception(0x38);
          tcu::NotSupportedError::NotSupportedError
                    (pNVar18,"Required memory size for sparse resource exceeds device limits.",
                     (char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
                     ,0x5d5);
          goto LAB_00649f38;
        }
        break;
      }
      uVar38 = uVar38 + 1;
    } while (uVar38 < deviceMemoryProperties.memoryTypeCount);
  }
  pNVar18 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (pNVar18,"No matching memory type found.",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRender.cpp"
             ,0x5d2);
LAB_00649f38:
  __cxa_throw(pNVar18,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void ShaderRenderCaseInstance::uploadSparseImage (const tcu::TextureFormat&		texFormat,
												  const TextureData&			textureData,
												  const tcu::Sampler&			refSampler,
												  const deUint32				mipLevels,
												  const deUint32				arrayLayers,
												  const VkImage					sparseImage,
												  const VkImageCreateInfo&		imageCreateInfo,
												  const tcu::UVec3				texSize)
{
	const VkDevice							vkDevice				= getDevice();
	const DeviceInterface&					vk						= getDeviceInterface();
	const VkPhysicalDevice					physicalDevice			= getPhysicalDevice();
	const VkQueue							queue					= getUniversalQueue();
	const deUint32							queueFamilyIndex		= getUniversalQueueFamilyIndex();
	const InstanceInterface&				instance				= getInstanceInterface();
	const VkPhysicalDeviceProperties		deviceProperties		= getPhysicalDeviceProperties(instance, physicalDevice);
	const VkPhysicalDeviceMemoryProperties	deviceMemoryProperties	= getPhysicalDeviceMemoryProperties(instance, physicalDevice);
	const bool								isShadowSampler			= refSampler.compare != tcu::Sampler::COMPAREMODE_NONE;
	const VkImageAspectFlags				aspectMask				= isShadowSampler ? VK_IMAGE_ASPECT_DEPTH_BIT : VK_IMAGE_ASPECT_COLOR_BIT;

	const Unique<VkSemaphore>				imageMemoryBindSemaphore(createSemaphore(vk, vkDevice));
	deUint32								bufferSize				= 0u;
	std::vector<deUint32>					offsetMultiples;
	offsetMultiples.push_back(4u);
	offsetMultiples.push_back(texFormat.getPixelSize());

	if (isImageSizeSupported(imageCreateInfo.imageType, texSize, deviceProperties.limits) == false)
		TCU_THROW(NotSupportedError, "Image size not supported for device.");

	// Calculate buffer size
	for (TextureData::const_iterator mit = textureData.begin(); mit != textureData.end(); ++mit)
	{
		for (TextureLayerData::const_iterator lit = mit->begin(); lit != mit->end(); ++lit)
		{
			const tcu::ConstPixelBufferAccess&	access	= *lit;

			bufferSize = getNextMultiple(offsetMultiples, bufferSize);
			bufferSize += access.getWidth() * access.getHeight() * access.getDepth() * access.getFormat().getPixelSize();
		}
	}

	{
		deUint32 sparseMemoryReqCount = 0;

		vk.getImageSparseMemoryRequirements(vkDevice, sparseImage, &sparseMemoryReqCount, DE_NULL);

		DE_ASSERT(sparseMemoryReqCount != 0);

		std::vector<VkSparseImageMemoryRequirements> sparseImageMemoryRequirements;
		sparseImageMemoryRequirements.resize(sparseMemoryReqCount);

		vk.getImageSparseMemoryRequirements(vkDevice, sparseImage, &sparseMemoryReqCount, &sparseImageMemoryRequirements[0]);

		const deUint32 noMatchFound = ~((deUint32)0);

		deUint32 colorAspectIndex = noMatchFound;
		for (deUint32 memoryReqNdx = 0; memoryReqNdx < sparseMemoryReqCount; ++memoryReqNdx)
		{
			if (sparseImageMemoryRequirements[memoryReqNdx].formatProperties.aspectMask & VK_IMAGE_ASPECT_COLOR_BIT)
			{
				colorAspectIndex = memoryReqNdx;
				break;
			}
		}

		if (colorAspectIndex == noMatchFound)
			TCU_THROW(NotSupportedError, "Not supported image aspect - the test supports currently only VK_IMAGE_ASPECT_COLOR_BIT.");

		const VkMemoryRequirements	memoryRequirements	= getImageMemoryRequirements(vk, vkDevice, sparseImage);

		deUint32 memoryType = noMatchFound;
		for (deUint32 memoryTypeNdx = 0; memoryTypeNdx < deviceMemoryProperties.memoryTypeCount; ++memoryTypeNdx)
		{
			if ((memoryRequirements.memoryTypeBits & (1u << memoryTypeNdx)) != 0 &&
				MemoryRequirement::Any.matchesHeap(deviceMemoryProperties.memoryTypes[memoryTypeNdx].propertyFlags))
			{
				memoryType = memoryTypeNdx;
				break;
			}
		}

		if (memoryType == noMatchFound)
			TCU_THROW(NotSupportedError, "No matching memory type found.");

		if (memoryRequirements.size > deviceProperties.limits.sparseAddressSpaceSize)
			TCU_THROW(NotSupportedError, "Required memory size for sparse resource exceeds device limits.");

		// Check if the image format supports sparse oprerations
		const std::vector<VkSparseImageFormatProperties> sparseImageFormatPropVec =
			getPhysicalDeviceSparseImageFormatProperties(instance, physicalDevice, imageCreateInfo.format, imageCreateInfo.imageType, imageCreateInfo.samples, imageCreateInfo.usage, imageCreateInfo.tiling);

		if (sparseImageFormatPropVec.size() == 0)
			TCU_THROW(NotSupportedError, "The image format does not support sparse operations.");

		const VkSparseImageMemoryRequirements		aspectRequirements	= sparseImageMemoryRequirements[colorAspectIndex];
		const VkExtent3D							imageGranularity	= aspectRequirements.formatProperties.imageGranularity;

		std::vector<VkSparseImageMemoryBind>		imageResidencyMemoryBinds;
		std::vector<VkSparseMemoryBind>				imageMipTailMemoryBinds;

		for (deUint32 layerNdx = 0; layerNdx < arrayLayers; ++ layerNdx)
		{
			for (deUint32 mipLevelNdx = 0; mipLevelNdx < aspectRequirements.imageMipTailFirstLod; ++mipLevelNdx)
			{
				const VkExtent3D	mipExtent		= mipLevelExtents(imageCreateInfo.extent, mipLevelNdx);
				const tcu::UVec3	numSparseBinds	= alignedDivide(mipExtent, imageGranularity);
				const tcu::UVec3	lastBlockExtent	= tcu::UVec3(mipExtent.width  % imageGranularity.width  ? mipExtent.width  % imageGranularity.width  : imageGranularity.width,
																 mipExtent.height % imageGranularity.height ? mipExtent.height % imageGranularity.height : imageGranularity.height,
																 mipExtent.depth  % imageGranularity.depth  ? mipExtent.depth  % imageGranularity.depth  : imageGranularity.depth );

				for (deUint32 z = 0; z < numSparseBinds.z(); ++z)
				for (deUint32 y = 0; y < numSparseBinds.y(); ++y)
				for (deUint32 x = 0; x < numSparseBinds.x(); ++x)
				{
					const VkMemoryRequirements allocRequirements =
					{
						// 28.7.5 alignment shows the block size in bytes
						memoryRequirements.alignment,		// VkDeviceSize	size;
						memoryRequirements.alignment,		// VkDeviceSize	alignment;
						memoryRequirements.memoryTypeBits,	// uint32_t		memoryTypeBits;
					};

					de::SharedPtr<Allocation> allocation(m_memAlloc.allocate(allocRequirements, MemoryRequirement::Any).release());

					m_allocations.push_back(allocation);

					VkOffset3D offset;
					offset.x = x*imageGranularity.width;
					offset.y = y*imageGranularity.height;
					offset.z = z*imageGranularity.depth;

					VkExtent3D extent;
					extent.width	= (x == numSparseBinds.x() - 1) ? lastBlockExtent.x() : imageGranularity.width;
					extent.height	= (y == numSparseBinds.y() - 1) ? lastBlockExtent.y() : imageGranularity.height;
					extent.depth	= (z == numSparseBinds.z() - 1) ? lastBlockExtent.z() : imageGranularity.depth;

					const VkSparseImageMemoryBind imageMemoryBind =
					{
						{
							aspectMask,	// VkImageAspectFlags	aspectMask;
							mipLevelNdx,// uint32_t				mipLevel;
							layerNdx,	// uint32_t				arrayLayer;
						},							// VkImageSubresource		subresource;
						offset,						// VkOffset3D				offset;
						extent,						// VkExtent3D				extent;
						allocation->getMemory(),	// VkDeviceMemory			memory;
						allocation->getOffset(),	// VkDeviceSize				memoryOffset;
						0u,							// VkSparseMemoryBindFlags	flags;
					};

					imageResidencyMemoryBinds.push_back(imageMemoryBind);
				}
			}

			// Handle MIP tail. There are two cases to consider here:
			//
			// 1) VK_SPARSE_IMAGE_FORMAT_SINGLE_MIPTAIL_BIT is requested by the driver: each layer needs a separate tail.
			// 2) otherwise:                                                            only one tail is needed.
			{
				if ( imageMipTailMemoryBinds.size() == 0                                                                                                   ||
					(imageMipTailMemoryBinds.size() != 0 && (aspectRequirements.formatProperties.flags & VK_SPARSE_IMAGE_FORMAT_SINGLE_MIPTAIL_BIT) == 0))
				{
					const VkMemoryRequirements allocRequirements =
					{
						aspectRequirements.imageMipTailSize,	// VkDeviceSize	size;
						memoryRequirements.alignment,			// VkDeviceSize	alignment;
						memoryRequirements.memoryTypeBits,		// uint32_t		memoryTypeBits;
					};

					const de::SharedPtr<Allocation> allocation(m_memAlloc.allocate(allocRequirements, MemoryRequirement::Any).release());

					const VkSparseMemoryBind imageMipTailMemoryBind =
					{
						aspectRequirements.imageMipTailOffset + layerNdx * aspectRequirements.imageMipTailStride,	// VkDeviceSize					resourceOffset;
						aspectRequirements.imageMipTailSize,														// VkDeviceSize					size;
						allocation->getMemory(),																	// VkDeviceMemory				memory;
						allocation->getOffset(),																	// VkDeviceSize					memoryOffset;
						0u,																							// VkSparseMemoryBindFlags		flags;
					};

					m_allocations.push_back(allocation);
					imageMipTailMemoryBinds.push_back(imageMipTailMemoryBind);
				}
			}
		}

		VkBindSparseInfo bindSparseInfo =
		{
			VK_STRUCTURE_TYPE_BIND_SPARSE_INFO,			//VkStructureType							sType;
			DE_NULL,									//const void*								pNext;
			0u,											//deUint32									waitSemaphoreCount;
			DE_NULL,									//const VkSemaphore*						pWaitSemaphores;
			0u,											//deUint32									bufferBindCount;
			DE_NULL,									//const VkSparseBufferMemoryBindInfo*		pBufferBinds;
			0u,											//deUint32									imageOpaqueBindCount;
			DE_NULL,									//const VkSparseImageOpaqueMemoryBindInfo*	pImageOpaqueBinds;
			0u,											//deUint32									imageBindCount;
			DE_NULL,									//const VkSparseImageMemoryBindInfo*		pImageBinds;
			1u,											//deUint32									signalSemaphoreCount;
			&imageMemoryBindSemaphore.get()				//const VkSemaphore*						pSignalSemaphores;
		};

		VkSparseImageMemoryBindInfo			imageResidencyBindInfo;
		VkSparseImageOpaqueMemoryBindInfo	imageMipTailBindInfo;

		if (imageResidencyMemoryBinds.size() > 0)
		{
			imageResidencyBindInfo.image		= sparseImage;
			imageResidencyBindInfo.bindCount	= static_cast<deUint32>(imageResidencyMemoryBinds.size());
			imageResidencyBindInfo.pBinds		= &imageResidencyMemoryBinds[0];

			bindSparseInfo.imageBindCount		= 1u;
			bindSparseInfo.pImageBinds			= &imageResidencyBindInfo;
		}

		if (imageMipTailMemoryBinds.size() > 0)
		{
			imageMipTailBindInfo.image = sparseImage;
			imageMipTailBindInfo.bindCount = static_cast<deUint32>(imageMipTailMemoryBinds.size());
			imageMipTailBindInfo.pBinds = &imageMipTailMemoryBinds[0];

			bindSparseInfo.imageOpaqueBindCount = 1u;
			bindSparseInfo.pImageOpaqueBinds = &imageMipTailBindInfo;
		}

		VK_CHECK(vk.queueBindSparse(queue, 1u, &bindSparseInfo, DE_NULL));
	}

	Move<VkCommandPool>		cmdPool;
	Move<VkCommandBuffer>	cmdBuffer;

	// Create command pool
	cmdPool = createCommandPool(vk, vkDevice, VK_COMMAND_POOL_CREATE_TRANSIENT_BIT, queueFamilyIndex);

	// Create command buffer
	cmdBuffer = allocateCommandBuffer(vk, vkDevice, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY);

	// Create source buffer
	const VkBufferCreateInfo bufferParams =
	{
		VK_STRUCTURE_TYPE_BUFFER_CREATE_INFO,		// VkStructureType		sType;
		DE_NULL,									// const void*			pNext;
		0u,											// VkBufferCreateFlags	flags;
		bufferSize,									// VkDeviceSize			size;
		VK_BUFFER_USAGE_TRANSFER_SRC_BIT,			// VkBufferUsageFlags	usage;
		VK_SHARING_MODE_EXCLUSIVE,					// VkSharingMode		sharingMode;
		0u,											// deUint32				queueFamilyIndexCount;
		DE_NULL,									// const deUint32*		pQueueFamilyIndices;
	};

	Move<VkBuffer>					buffer		= createBuffer(vk, vkDevice, &bufferParams);
	de::MovePtr<Allocation>			bufferAlloc = m_memAlloc.allocate(getBufferMemoryRequirements(vk, vkDevice, *buffer), MemoryRequirement::HostVisible);
	VK_CHECK(vk.bindBufferMemory(vkDevice, *buffer, bufferAlloc->getMemory(), bufferAlloc->getOffset()));

	// Barriers for copying buffer to image
	const VkBufferMemoryBarrier preBufferBarrier =
	{
		VK_STRUCTURE_TYPE_BUFFER_MEMORY_BARRIER,	// VkStructureType	sType;
		DE_NULL,									// const void*		pNext;
		VK_ACCESS_HOST_WRITE_BIT,					// VkAccessFlags	srcAccessMask;
		VK_ACCESS_TRANSFER_READ_BIT,				// VkAccessFlags	dstAccessMask;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32			srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,					// deUint32			dstQueueFamilyIndex;
		*buffer,									// VkBuffer			buffer;
		0u,											// VkDeviceSize		offset;
		bufferSize									// VkDeviceSize		size;
	};

	const VkImageMemoryBarrier preImageBarrier =
	{
		VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,			// VkStructureType			sType;
		DE_NULL,										// const void*				pNext;
		0u,												// VkAccessFlags			srcAccessMask;
		VK_ACCESS_TRANSFER_WRITE_BIT,					// VkAccessFlags			dstAccessMask;
		VK_IMAGE_LAYOUT_UNDEFINED,						// VkImageLayout			oldLayout;
		VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,			// VkImageLayout			newLayout;
		VK_QUEUE_FAMILY_IGNORED,						// deUint32					srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,						// deUint32					dstQueueFamilyIndex;
		sparseImage,									// VkImage					image;
		{												// VkImageSubresourceRange	subresourceRange;
			aspectMask,								// VkImageAspect	aspect;
			0u,										// deUint32			baseMipLevel;
			mipLevels,								// deUint32			mipLevels;
			0u,										// deUint32			baseArraySlice;
			arrayLayers								// deUint32			arraySize;
		}
	};

	const VkImageMemoryBarrier postImageBarrier =
	{
		VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER,			// VkStructureType			sType;
		DE_NULL,										// const void*				pNext;
		VK_ACCESS_TRANSFER_WRITE_BIT,					// VkAccessFlags			srcAccessMask;
		VK_ACCESS_SHADER_READ_BIT,						// VkAccessFlags			dstAccessMask;
		VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL,			// VkImageLayout			oldLayout;
		VK_IMAGE_LAYOUT_SHADER_READ_ONLY_OPTIMAL,		// VkImageLayout			newLayout;
		VK_QUEUE_FAMILY_IGNORED,						// deUint32					srcQueueFamilyIndex;
		VK_QUEUE_FAMILY_IGNORED,						// deUint32					dstQueueFamilyIndex;
		sparseImage,									// VkImage					image;
		{												// VkImageSubresourceRange	subresourceRange;
			aspectMask,								// VkImageAspect	aspect;
			0u,										// deUint32			baseMipLevel;
			mipLevels,								// deUint32			mipLevels;
			0u,										// deUint32			baseArraySlice;
			arrayLayers								// deUint32			arraySize;
		}
	};

	const VkCommandBufferBeginInfo cmdBufferBeginInfo =
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,	// VkStructureType					sType;
		DE_NULL,										// const void*						pNext;
		VK_COMMAND_BUFFER_USAGE_ONE_TIME_SUBMIT_BIT,	// VkCommandBufferUsageFlags		flags;
		(const VkCommandBufferInheritanceInfo*)DE_NULL,
	};

	std::vector<VkBufferImageCopy>	copyRegions;
	// Get copy regions and write buffer data
	{
		deUint32	layerDataOffset		= 0;
		deUint8*	destPtr				= (deUint8*)bufferAlloc->getHostPtr();

		for (size_t levelNdx = 0; levelNdx < textureData.size(); levelNdx++)
		{
			const TextureLayerData&		layerData	= textureData[levelNdx];

			for (size_t layerNdx = 0; layerNdx < layerData.size(); layerNdx++)
			{
				layerDataOffset = getNextMultiple(offsetMultiples, layerDataOffset);

				const tcu::ConstPixelBufferAccess&	access		= layerData[layerNdx];
				const tcu::PixelBufferAccess		destAccess	(access.getFormat(), access.getSize(), destPtr + layerDataOffset);

				const VkBufferImageCopy				layerRegion =
				{
					layerDataOffset,						// VkDeviceSize				bufferOffset;
					(deUint32)access.getWidth(),			// deUint32					bufferRowLength;
					(deUint32)access.getHeight(),			// deUint32					bufferImageHeight;
					{										// VkImageSubresourceLayers	imageSubresource;
						aspectMask,								// VkImageAspectFlags		aspectMask;
						(deUint32)levelNdx,						// uint32_t					mipLevel;
						(deUint32)layerNdx,						// uint32_t					baseArrayLayer;
						1u										// uint32_t					layerCount;
					},
					{ 0u, 0u, 0u },							// VkOffset3D			imageOffset;
					{										// VkExtent3D			imageExtent;
						(deUint32)access.getWidth(),
						(deUint32)access.getHeight(),
						(deUint32)access.getDepth()
					}
				};

				copyRegions.push_back(layerRegion);
				tcu::copy(destAccess, access);

				layerDataOffset += access.getWidth() * access.getHeight() * access.getDepth() * access.getFormat().getPixelSize();
			}
		}
	}

	// Copy buffer to image
	VK_CHECK(vk.beginCommandBuffer(*cmdBuffer, &cmdBufferBeginInfo));
	vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_HOST_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 1, &preBufferBarrier, 1, &preImageBarrier);
	vk.cmdCopyBufferToImage(*cmdBuffer, *buffer, sparseImage, VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL, (deUint32)copyRegions.size(), copyRegions.data());
	vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, (VkDependencyFlags)0, 0, (const VkMemoryBarrier*)DE_NULL, 0, (const VkBufferMemoryBarrier*)DE_NULL, 1, &postImageBarrier);
	VK_CHECK(vk.endCommandBuffer(*cmdBuffer));

	const VkPipelineStageFlags pipelineStageFlags = VK_PIPELINE_STAGE_ALL_GRAPHICS_BIT;

	const VkSubmitInfo submitInfo =
	{
		VK_STRUCTURE_TYPE_SUBMIT_INFO,			// VkStructureType				sType;
		DE_NULL,								// const void*					pNext;
		1u,										// deUint32						waitSemaphoreCount;
		&imageMemoryBindSemaphore.get(),		// const VkSemaphore*			pWaitSemaphores;
		&pipelineStageFlags,					// const VkPipelineStageFlags*	pWaitDstStageMask;
		1u,										// deUint32						commandBufferCount;
		&cmdBuffer.get(),						// const VkCommandBuffer*		pCommandBuffers;
		0u,										// deUint32						signalSemaphoreCount;
		DE_NULL									// const VkSemaphore*			pSignalSemaphores;
	};

	Move<VkFence>	fence = createFence(vk, vkDevice);

	try
	{
		VK_CHECK(vk.queueSubmit(queue, 1, &submitInfo, *fence));
		VK_CHECK(vk.waitForFences(vkDevice, 1, &fence.get(), true, ~(0ull) /* infinity */));
	}
	catch (...)
	{
		VK_CHECK(vk.deviceWaitIdle(vkDevice));
		throw;
	}
}